

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_start.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  bool bVar1;
  int __how;
  buffer_serializer bs_log;
  ptr<buffer> log;
  string msg;
  ptr<raft_server> server;
  int port_number;
  raft_launcher launcher;
  raft_params params;
  options asio_opt;
  ptr<state_mgr> my_state_manager;
  ptr<state_machine> my_state_machine;
  ptr<logger> my_logger;
  shared_ptr<echo_state_machine> *in_stack_fffffffffffffb78;
  raft_params *params_given;
  asio_service_options *in_stack_fffffffffffffb80;
  asio_service_options *this;
  int *in_stack_fffffffffffffb88;
  string *str;
  buffer_serializer *in_stack_fffffffffffffb90;
  allocator_type *in_stack_fffffffffffffba8;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_fffffffffffffbb0;
  undefined8 ***pppuVar2;
  iterator in_stack_fffffffffffffbb8;
  undefined8 ***pppuVar3;
  size_type in_stack_fffffffffffffbc0;
  allocator *logs;
  undefined4 in_stack_fffffffffffffbe8;
  uint uVar4;
  undefined1 **local_3f8 [2];
  undefined8 **local_3e8;
  undefined8 local_3e0;
  allocator local_381;
  string local_380 [36];
  int local_35c;
  duration<long,std::ratio<1l,1000l>> local_358 [8];
  string local_350 [24];
  size_t in_stack_fffffffffffffcc8;
  undefined1 local_320 [16];
  ptr<logger> local_310;
  ptr<state_mgr> local_300;
  undefined1 local_2f0 [72];
  undefined1 local_2a8 [564];
  undefined4 local_74;
  int local_4;
  
  local_4 = 0;
  std::shared_ptr<nuraft::logger>::shared_ptr
            ((shared_ptr<nuraft::logger> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  nuraft::cs_new<echo_state_machine>();
  std::shared_ptr<nuraft::state_machine>::shared_ptr<echo_state_machine,void>
            ((shared_ptr<nuraft::state_machine> *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78);
  std::shared_ptr<echo_state_machine>::~shared_ptr((shared_ptr<echo_state_machine> *)0x17d69b);
  local_74 = 1;
  nuraft::cs_new<nuraft::inmem_state_mgr,int,char_const(&)[16]>
            (in_stack_fffffffffffffb88,(char (*) [16])in_stack_fffffffffffffb80);
  std::shared_ptr<nuraft::state_mgr>::shared_ptr<nuraft::inmem_state_mgr,void>
            ((shared_ptr<nuraft::state_mgr> *)in_stack_fffffffffffffb80,
             (shared_ptr<nuraft::inmem_state_mgr> *)in_stack_fffffffffffffb78);
  std::shared_ptr<nuraft::inmem_state_mgr>::~shared_ptr
            ((shared_ptr<nuraft::inmem_state_mgr> *)0x17d6e8);
  nuraft::asio_service_options::asio_service_options(in_stack_fffffffffffffb80);
  nuraft::raft_params::raft_params((raft_params *)local_2a8);
  nuraft::raft_launcher::raft_launcher((raft_launcher *)in_stack_fffffffffffffb80);
  local_2f0._20_4_ = 0x3039;
  std::shared_ptr<nuraft::state_machine>::shared_ptr
            ((shared_ptr<nuraft::state_machine> *)in_stack_fffffffffffffb80,
             (shared_ptr<nuraft::state_machine> *)in_stack_fffffffffffffb78);
  std::shared_ptr<nuraft::state_mgr>::shared_ptr
            ((shared_ptr<nuraft::state_mgr> *)in_stack_fffffffffffffb80,
             (shared_ptr<nuraft::state_mgr> *)in_stack_fffffffffffffb78);
  std::shared_ptr<nuraft::logger>::shared_ptr
            ((shared_ptr<nuraft::logger> *)in_stack_fffffffffffffb80,
             (shared_ptr<nuraft::logger> *)in_stack_fffffffffffffb78);
  uVar4 = local_2f0._20_4_;
  nuraft::raft_server::init_options::init_options((init_options *)in_stack_fffffffffffffb80);
  str = local_350;
  this = (asio_service_options *)local_2a8;
  params_given = (raft_params *)(local_2a8 + 0x68);
  nuraft::raft_launcher::init
            ((raft_launcher *)local_2f0,(ptr<state_machine> *)(local_2f0 + 0x18),&local_300,
             &local_310,(int)local_320,(options *)(ulong)uVar4,params_given,(init_options *)this);
  nuraft::raft_server::init_options::~init_options((init_options *)0x17d7e0);
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x17d7ed);
  std::shared_ptr<nuraft::state_mgr>::~shared_ptr((shared_ptr<nuraft::state_mgr> *)0x17d7fa);
  std::shared_ptr<nuraft::state_machine>::~shared_ptr((shared_ptr<nuraft::state_machine> *)0x17d807)
  ;
  while( true ) {
    std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x17d814);
    bVar1 = nuraft::raft_server::is_initialized((raft_server *)0x17d81c);
    in_stack_fffffffffffffbe8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbe8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_35c = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_358,&local_35c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffbb0);
  }
  logs = &local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"hello world",logs);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::size();
  nuraft::buffer::alloc(in_stack_fffffffffffffcc8);
  nuraft::buffer_serializer::buffer_serializer
            (in_stack_fffffffffffffb90,(ptr<buffer> *)str,(endianness)((ulong)this >> 0x20));
  nuraft::buffer_serializer::put_str(in_stack_fffffffffffffb90,str);
  std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17d9de);
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)this,(shared_ptr<nuraft::buffer> *)params_given);
  local_3e0 = 1;
  local_3e8 = local_3f8;
  std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
            ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x17da28);
  __l._M_len = in_stack_fffffffffffffbc0;
  __l._M_array = in_stack_fffffffffffffbb8;
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  vector(in_stack_fffffffffffffbb0,__l,in_stack_fffffffffffffba8);
  nuraft::raft_server::append_entries
            ((raft_server *)CONCAT44(uVar4,in_stack_fffffffffffffbe8),
             (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)logs);
  std::
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
  ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                 *)0x17da75);
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
           *)in_stack_fffffffffffffb90);
  std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
            ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x17da8f);
  pppuVar3 = (undefined8 ***)local_3f8;
  pppuVar2 = &local_3e8;
  do {
    pppuVar2 = pppuVar2 + -2;
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x17dab8);
  } while (pppuVar2 != pppuVar3);
  nuraft::raft_launcher::shutdown((raft_launcher *)(local_2f0 + 0x18),5,__how);
  local_4 = 0;
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x17daf8);
  std::__cxx11::string::~string(local_380);
  std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x17db12);
  nuraft::raft_launcher::~raft_launcher((raft_launcher *)this);
  nuraft::asio_service_options::~asio_service_options(this);
  std::shared_ptr<nuraft::state_mgr>::~shared_ptr((shared_ptr<nuraft::state_mgr> *)0x17db39);
  std::shared_ptr<nuraft::state_machine>::~shared_ptr((shared_ptr<nuraft::state_machine> *)0x17db46)
  ;
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x17db53);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    // Replace with your logger, state machine, and state manager.
    ptr<logger>         my_logger = nullptr;
    ptr<state_machine>  my_state_machine = cs_new<echo_state_machine>();
    ptr<state_mgr>      my_state_manager =
        cs_new<inmem_state_mgr>(1, "localhost:12345");

    asio_service::options   asio_opt;   // your Asio options
    raft_params             params;     // your Raft parameters

    // Initialize Raft server listening on port 12345.
    // It will organize a single-node Raft cluster.
    raft_launcher       launcher;
    int                 port_number = 12345;
    ptr<raft_server>    server = launcher.init(my_state_machine,
                                               my_state_manager,
                                               my_logger,
                                               port_number,
                                               asio_opt,
                                               params);
    // Need to wait for initialization.
    while (!server->is_initialized()) {
        std::this_thread::sleep_for( std::chrono::milliseconds(100) );
    }

    // Append a log, containing a string `hello world` and its 4-byte length.
    std::string msg = "hello world";
    ptr<buffer> log = buffer::alloc(sizeof(int) + msg.size());
    buffer_serializer bs_log(log);
    bs_log.put_str(msg);
    server->append_entries({log});

    // Shutdown.
    launcher.shutdown();
    return 0;
}